

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffered_stream.c
# Opt level: O1

void save_to_check_buffer_and_close
               (cio_buffered_stream *bs,void *context,cio_error err,cio_read_buffer *buffer,
               size_t num_bytes)

{
  size_t sVar1;
  
  sVar1 = first_check_buffer_pos;
  if (err == CIO_SUCCESS) {
    memcpy(first_check_buffer + first_check_buffer_pos,buffer->fetch_ptr,num_bytes);
    buffer->fetch_ptr = buffer->fetch_ptr + num_bytes;
    first_check_buffer_pos = sVar1 + num_bytes;
  }
  cio_buffered_stream_close(bs);
  return;
}

Assistant:

static void save_to_check_buffer_and_close(struct cio_buffered_stream *bs, void *context, enum cio_error err, struct cio_read_buffer *buffer, size_t num_bytes)
{
	save_to_check_buffer(bs, context, err, buffer, num_bytes);
	cio_buffered_stream_close(bs);
}